

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

char * JS_ToCStringLen2(JSContext *ctx,size_t *plen,JSValue val1,BOOL cesu8)

{
  byte bVar1;
  ushort uVar2;
  JSValue val_00;
  JSValue v;
  JSRefCountHeader *pJVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  ulong *in_RSI;
  JSContext *in_RDI;
  int in_R8D;
  JSValue JVar8;
  uint16_t *src_1;
  int count;
  uint8_t *src;
  uint8_t *q;
  int c1;
  int c;
  int len;
  int pos;
  JSString *str_new;
  JSString *str;
  JSValue val;
  JSValueUnion in_stack_ffffffffffffff58;
  JSContext *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  JSValueUnion in_stack_ffffffffffffff78;
  JSValueUnion local_78;
  JSString *local_68;
  uint local_5c;
  int local_54;
  JSString *local_50;
  JSValueUnion local_40;
  
  if ((int)in_RCX == -7) {
    JVar8.tag = in_RCX;
    JVar8.u.float64 = in_RDX.float64;
    JVar8 = JS_DupValue(in_RDI,JVar8);
    local_40 = JVar8.u;
    in_stack_ffffffffffffff78 = local_40;
  }
  else {
    val_00.tag = (int64_t)in_stack_ffffffffffffff60;
    val_00.u.float64 = in_stack_ffffffffffffff58.float64;
    JVar8 = JS_ToString((JSContext *)0x122ab6,val_00);
    local_78 = JVar8.u;
    local_40 = local_78;
    iVar4 = JS_IsException(JVar8);
    if (iVar4 != 0) goto LAB_00122e94;
  }
  uVar5 = (uint)*(undefined8 *)((long)local_40.ptr + 4) & 0x7fffffff;
  if ((*(ulong *)((long)local_40.ptr + 4) >> 0x1f & 1) == 0) {
    pcVar7 = (char *)((long)local_40.ptr + 0x10);
    in_stack_ffffffffffffff6c = 0;
    for (local_54 = 0; local_54 < (int)uVar5; local_54 = local_54 + 1) {
      in_stack_ffffffffffffff6c =
           ((int)(uint)(byte)pcVar7[local_54] >> 7) + in_stack_ffffffffffffff6c;
    }
    if (in_stack_ffffffffffffff6c == 0) {
      if (in_RSI == (ulong *)0x0) {
        return pcVar7;
      }
      *in_RSI = (long)(int)uVar5;
      return pcVar7;
    }
    local_50 = js_alloc_string((JSContext *)in_stack_ffffffffffffff78.ptr,
                               (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
    if (local_50 != (JSString *)0x0) {
      local_68 = local_50 + 1;
      for (local_54 = 0; local_54 < (int)uVar5; local_54 = local_54 + 1) {
        bVar1 = pcVar7[local_54];
        if (bVar1 < 0x80) {
          *(byte *)&(local_68->header).ref_count = bVar1;
          local_68 = (JSString *)((long)&(local_68->header).ref_count + 1);
        }
        else {
          pJVar3 = &local_68->header;
          *(byte *)&(local_68->header).ref_count = (byte)((int)(uint)bVar1 >> 6) | 0xc0;
          local_68 = (JSString *)((long)&(local_68->header).ref_count + 2);
          *(byte *)((long)&pJVar3->ref_count + 1) = bVar1 & 0x3f | 0x80;
        }
      }
LAB_00122e04:
      *(undefined1 *)&(local_68->header).ref_count = 0;
      *(ulong *)&local_50->field_0x4 =
           *(ulong *)&local_50->field_0x4 & 0xffffffff80000000 |
           (ulong)(uint)((int)local_68 - ((int)local_50 + 0x10)) & 0x7fffffff;
      v.u._4_4_ = in_stack_ffffffffffffff6c;
      v.u.int32 = in_stack_ffffffffffffff68;
      v.tag._0_4_ = (int)pcVar7;
      v.tag._4_4_ = (int)((ulong)pcVar7 >> 0x20);
      JS_FreeValue(in_stack_ffffffffffffff60,v);
      if (in_RSI != (ulong *)0x0) {
        *in_RSI = (ulong)((uint)*(undefined8 *)&local_50->field_0x4 & 0x7fffffff);
      }
      return (char *)(local_50 + 1);
    }
  }
  else {
    in_stack_ffffffffffffff60 = (JSContext *)((long)local_40.ptr + 0x10);
    local_50 = js_alloc_string((JSContext *)in_stack_ffffffffffffff78.ptr,in_stack_ffffffffffffff74,
                               in_stack_ffffffffffffff70);
    if (local_50 != (JSString *)0x0) {
      local_54 = 0;
      local_68 = local_50 + 1;
      while (pcVar7 = (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
            local_54 < (int)uVar5) {
        iVar4 = local_54 + 1;
        uVar2 = *(ushort *)
                 ((long)&(in_stack_ffffffffffffff60->header).ref_count + (long)local_54 * 2);
        local_5c = (uint)uVar2;
        if (local_5c < 0x80) {
          *(char *)&(local_68->header).ref_count = (char)uVar2;
          local_68 = (JSString *)((long)&(local_68->header).ref_count + 1);
          local_54 = iVar4;
        }
        else {
          if ((((0xd7ff < local_5c) && (local_5c < 0xdc00)) && (iVar4 < (int)uVar5)) &&
             (((in_R8D == 0 &&
               (uVar6 = (uint)*(ushort *)
                               ((long)&(in_stack_ffffffffffffff60->header).ref_count +
                               (long)iVar4 * 2), 0xdbff < uVar6)) && (uVar6 < 0xe000)))) {
            local_5c = ((local_5c & 0x3ff) << 10 | uVar6 & 0x3ff) + 0x10000;
            iVar4 = local_54 + 2;
          }
          local_54 = iVar4;
          iVar4 = unicode_to_utf8((uint8_t *)local_68,local_5c);
          local_68 = (JSString *)((long)&(local_68->header).ref_count + (long)iVar4);
        }
      }
      goto LAB_00122e04;
    }
  }
LAB_00122e94:
  if (in_RSI != (ulong *)0x0) {
    *in_RSI = 0;
  }
  return (char *)0x0;
}

Assistant:

const char *JS_ToCStringLen2(JSContext *ctx, size_t *plen, JSValueConst val1, BOOL cesu8)
{
    JSValue val;
    JSString *str, *str_new;
    int pos, len, c, c1;
    uint8_t *q;

    if (JS_VALUE_GET_TAG(val1) != JS_TAG_STRING) {
        val = JS_ToString(ctx, val1);
        if (JS_IsException(val))
            goto fail;
    } else {
        val = JS_DupValue(ctx, val1);
    }

    str = JS_VALUE_GET_STRING(val);
    len = str->len;
    if (!str->is_wide_char) {
        const uint8_t *src = str->u.str8;
        int count;

        /* count the number of non-ASCII characters */
        /* Scanning the whole string is required for ASCII strings,
           and computing the number of non-ASCII bytes is less expensive
           than testing each byte, hence this method is faster for ASCII
           strings, which is the most common case.
         */
        count = 0;
        for (pos = 0; pos < len; pos++) {
            count += src[pos] >> 7;
        }
        if (count == 0) {
            if (plen)
                *plen = len;
            return (const char *)src;
        }
        str_new = js_alloc_string(ctx, len + count, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        for (pos = 0; pos < len; pos++) {
            c = src[pos];
            if (c < 0x80) {
                *q++ = c;
            } else {
                *q++ = (c >> 6) | 0xc0;
                *q++ = (c & 0x3f) | 0x80;
            }
        }
    } else {
        const uint16_t *src = str->u.str16;
        /* Allocate 3 bytes per 16 bit code point. Surrogate pairs may
           produce 4 bytes but use 2 code points.
         */
        str_new = js_alloc_string(ctx, len * 3, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        pos = 0;
        while (pos < len) {
            c = src[pos++];
            if (c < 0x80) {
                *q++ = c;
            } else {
                if (c >= 0xd800 && c < 0xdc00) {
                    if (pos < len && !cesu8) {
                        c1 = src[pos];
                        if (c1 >= 0xdc00 && c1 < 0xe000) {
                            pos++;
                            /* surrogate pair */
                            c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
                        } else {
                            /* Keep unmatched surrogate code points */
                            /* c = 0xfffd; */ /* error */
                        }
                    } else {
                        /* Keep unmatched surrogate code points */
                        /* c = 0xfffd; */ /* error */
                    }
                }
                q += unicode_to_utf8(q, c);
            }
        }
    }

    *q = '\0';
    str_new->len = q - str_new->u.str8;
    JS_FreeValue(ctx, val);
    if (plen)
        *plen = str_new->len;
    return (const char *)str_new->u.str8;
 fail:
    if (plen)
        *plen = 0;
    return NULL;
}